

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddChrpathPatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  cmComputeLinkInformation *this_00;
  string *psVar6;
  ostream *poVar7;
  cmGlobalGenerator *pcVar8;
  iterator iVar9;
  Indent IVar10;
  string *i;
  pointer pbVar11;
  _Alloc_hider _Var12;
  string runpath;
  int darwin_major_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRuntimeDirs;
  string installNameTool;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldRuntimeDirs;
  string darwin_major_version_s;
  istringstream ss;
  ostringstream msg;
  key_type local_3e8;
  string *local_3c8;
  cmMakefile *local_3c0;
  string *local_3b8;
  int local_3ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  long local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  long *local_350 [2];
  long local_340 [2];
  pointer local_330;
  string local_328;
  byte abStack_308 [88];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  if (((this->ImportLibrary == false) &&
      (local_3c8 = toDestDirPath, local_3b8 = config,
      bVar4 = cmGeneratorTarget::IsChrpathUsed(this->Target,config), bVar4)) &&
     (this_00 = cmGeneratorTarget::GetLinkInformation(this->Target,local_3b8),
     this_00 != (cmComputeLinkInformation *)0x0)) {
    pcVar1 = this->Target->Target->Makefile;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_328,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
    local_3c0 = pcVar1;
    bVar4 = cmMakefile::IsOn(pcVar1,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_328,"CMAKE_INSTALL_NAME_TOOL","");
      pcVar1 = local_3c0;
      psVar6 = cmMakefile::GetSafeDefinition(local_3c0,&local_328);
      local_388 = &local_378;
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar2,pcVar2 + psVar6->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmComputeLinkInformation::GetRPath(this_00,&local_368,false);
      cmComputeLinkInformation::GetRPath(this_00,&local_3a8,true);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_328,"DARWIN_MAJOR_VERSION","");
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_328);
      local_350[0] = local_340;
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_350,pcVar2,pcVar2 + psVar6->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_328,(string *)local_350,_S_in);
      std::istream::operator>>((istream *)&local_328,&local_3ac);
      if ((((abStack_308[*(long *)(local_328._M_dataplus._M_p + -0x18)] & 5) == 0) &&
          (local_3ac < 10)) &&
         ((local_368.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_368.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish ||
          (local_3a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_3a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"WARNING: Target \"",0x11);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\" has runtime paths which cannot be changed during install.  ",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"To change runtime paths, OS X version 10.6 or newer is required.  ",0x42)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"Therefore, runtime paths will not be changed when installing.  ",0x3f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around this limitation.",0x4a
                  );
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,WARNING,&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        local_198._8_8_ = local_1a8 + 8;
        local_1a8._8_4_ = _S_red;
        local_198._M_allocated_capacity = 0;
        local_180 = 0;
        local_330 = local_368.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pbVar11 = local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_188 = (_Base_ptr)local_198._8_8_;
        if (local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            pcVar8 = cmMakefile::GetGlobalGenerator(local_3c0);
            (*pcVar8->_vptr_cmGlobalGenerator[0x14])(&local_3e8,pcVar8,pbVar11,local_3b8);
            iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1a8,&local_3e8);
            if (iVar9._M_node == (_Base_ptr)(local_1a8 + 8)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_1a8,&local_3e8);
              IVar10.Level = indent.Level;
              if (0 < indent.Level) {
                do {
                  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                  IVar10.Level = IVar10.Level + -1;
                } while (IVar10.Level != 0);
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND ",0x18)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,local_388->_M_local_buf,local_380);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              IVar10.Level = indent.Level;
              if (0 < indent.Level) {
                do {
                  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                  IVar10.Level = IVar10.Level + -1;
                } while (IVar10.Level != 0);
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"  -delete_rpath \"",0x11);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
              IVar10.Level = indent.Level;
              if (0 < indent.Level) {
                do {
                  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                  IVar10.Level = IVar10.Level + -1;
                } while (IVar10.Level != 0);
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,(local_3c8->_M_dataplus)._M_p,local_3c8->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1
                             );
            }
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 != local_330);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a8);
        pbVar3 = local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = local_3a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar3;
            pbVar11 = pbVar11 + 1) {
          pcVar8 = cmMakefile::GetGlobalGenerator(local_3c0);
          (*pcVar8->_vptr_cmGlobalGenerator[0x14])(&local_3e8,pcVar8,pbVar11,local_3b8);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1a8,&local_3e8);
          if (iVar9._M_node == (_Base_ptr)(local_1a8 + 8)) {
            IVar10.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar10.Level = IVar10.Level + -1;
              } while (IVar10.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND ",0x18);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,local_388->_M_local_buf,local_380);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            IVar10.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar10.Level = IVar10.Level + -1;
              } while (IVar10.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  -add_rpath \"",0xe);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
            IVar10.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar10.Level = IVar10.Level + -1;
              } while (IVar10.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,(local_3c8->_M_dataplus)._M_p,local_3c8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1a8);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_328);
      std::ios_base::~ios_base(local_2b0);
      if (local_350[0] != local_340) {
        operator_delete(local_350[0],local_340[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_368);
      local_328.field_2._M_allocated_capacity = local_378._M_allocated_capacity;
      _Var12._M_p = (pointer)local_388;
      if (local_388 == &local_378) {
        return;
      }
    }
    else {
      cmComputeLinkInformation::GetRPathString_abi_cxx11_(&local_328,this_00,false);
      cmComputeLinkInformation::GetChrpathString_abi_cxx11_((string *)local_1a8,this_00);
      if ((local_328._M_string_length != CONCAT44(local_1a8._12_4_,local_1a8._8_4_)) ||
         ((local_328._M_string_length != 0 &&
          (iVar5 = bcmp(local_328._M_dataplus._M_p,(void *)local_1a8._0_8_,
                        local_328._M_string_length), iVar5 != 0)))) {
        IVar10.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar10.Level = IVar10.Level + -1;
          } while (IVar10.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"file(RPATH_CHANGE\n",0x12);
        IVar10.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar10.Level = IVar10.Level + -1;
          } while (IVar10.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"     FILE \"",0xb);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,(local_3c8->_M_dataplus)._M_p,local_3c8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        IVar10.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            IVar10.Level = IVar10.Level + -1;
          } while (IVar10.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"     OLD_RPATH \"",0x10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_328._M_dataplus._M_p,local_328._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"     NEW_RPATH \"",0x10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_1a8._0_8_,
                            CONCAT44(local_1a8._12_4_,local_1a8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      _Var12._M_p = local_328._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p == &local_328.field_2) {
        return;
      }
    }
    operator_delete(_Var12._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddChrpathPatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  cmMakefile* mf = this->Target->Target->GetMakefile();

  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // If using install_name_tool, set up the rules to modify the rpaths.
    std::string installNameTool =
      mf->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL");

    std::vector<std::string> oldRuntimeDirs, newRuntimeDirs;
    cli->GetRPath(oldRuntimeDirs, false);
    cli->GetRPath(newRuntimeDirs, true);

    std::string darwin_major_version_s =
      mf->GetSafeDefinition("DARWIN_MAJOR_VERSION");

    std::istringstream ss(darwin_major_version_s);
    int darwin_major_version;
    ss >> darwin_major_version;
    if (!ss.fail() && darwin_major_version <= 9 &&
        (!oldRuntimeDirs.empty() || !newRuntimeDirs.empty())) {
      std::ostringstream msg;
      msg
        << "WARNING: Target \"" << this->Target->GetName()
        << "\" has runtime paths which cannot be changed during install.  "
        << "To change runtime paths, OS X version 10.6 or newer is required.  "
        << "Therefore, runtime paths will not be changed when installing.  "
        << "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around"
           " this limitation.";
      mf->IssueMessage(MessageType::WARNING, msg.str());
    } else {
      // Note: These paths are kept unique to avoid
      // install_name_tool corruption.
      std::set<std::string> runpaths;
      for (std::string const& i : oldRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          runpaths.insert(runpath);
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -delete_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }

      runpaths.clear();
      for (std::string const& i : newRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -add_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }
    }
  } else {
    // Construct the original rpath string to be replaced.
    std::string oldRpath = cli->GetRPathString(false);

    // Get the install RPATH from the link information.
    std::string newRpath = cli->GetChrpathString();

    // Skip the rule if the paths are identical
    if (oldRpath == newRpath) {
      return;
    }

    // Write a rule to run chrpath to set the install-tree RPATH
    os << indent << "file(RPATH_CHANGE\n"
       << indent << "     FILE \"" << toDestDirPath << "\"\n"
       << indent << "     OLD_RPATH \"" << oldRpath << "\"\n"
       << indent << "     NEW_RPATH \"" << newRpath << "\")\n";
  }
}